

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O2

void __thiscall QSequentialAnimationGroupPrivate::restart(QSequentialAnimationGroupPrivate *this)

{
  parameter_type pVar1;
  parameter_type pVar2;
  int index;
  
  pVar1 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
          ::value(&(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.direction);
  if (pVar1 == Forward) {
    this->lastLoop = 0;
    if (this->currentAnimationIndex == 0) goto LAB_0036baa7;
    index = 0;
  }
  else {
    pVar2 = QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
            ::value(&(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.loopCount)
    ;
    this->lastLoop = pVar2 + -1;
    index = (int)(this->super_QAnimationGroupPrivate).animations.d.size + -1;
    if (this->currentAnimationIndex == index) {
LAB_0036baa7:
      activateCurrentAnimation(this,false);
      return;
    }
  }
  setCurrentAnimation(this,index,false);
  return;
}

Assistant:

void QSequentialAnimationGroupPrivate::restart()
{
    // restarting the group by making the first/last animation the current one
    if (direction == QAbstractAnimation::Forward) {
        lastLoop = 0;
        if (currentAnimationIndex == 0)
            activateCurrentAnimation();
        else
            setCurrentAnimation(0);
    } else { // direction == QAbstractAnimation::Backward
        lastLoop = loopCount - 1;
        int index = animations.size() - 1;
        if (currentAnimationIndex == index)
            activateCurrentAnimation();
        else
            setCurrentAnimation(index);
    }
}